

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AStateProvider_A_FireProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  undefined8 *puVar3;
  void *pvVar4;
  AWeapon *this;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  AActor *this_00;
  PClassActor *pPVar8;
  AActor *source;
  TArray<VMValue,_VMValue> *pTVar9;
  char *pcVar10;
  byte bVar11;
  uint uVar12;
  PClassActor *type;
  bool bVar13;
  bool bVar14;
  void *pvVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  DAngle local_58;
  FTranslatedLineTarget t;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003ce4b7:
    pcVar10 = "(paramnum) < numparam";
LAB_003ce4d0:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ce4ae:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003ce4d0;
  }
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_003ce08d;
    pPVar7 = (source->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar6 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
      (source->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar13 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar13;
    bVar14 = pPVar7 == pPVar5;
    if (!bVar14 && !bVar13) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar5) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pTVar9 = (TArray<VMValue,_VMValue> *)(ulong)(bVar14 || bVar13);
    uVar12 = (uint)bVar13;
    if ((char)ret == '\0') {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ce4d0;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_003ce4ae;
LAB_003ce08d:
    source = (AActor *)0x0;
    pTVar9 = defaultparam;
    uVar12 = numparam;
  }
  pPVar5 = AStateProvider::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_003ce4b7;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003ce4ae;
  puVar3 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar3 != (undefined8 *)0x0) {
      pPVar7 = (PClass *)puVar3[1];
      if (pPVar7 == (PClass *)0x0) {
        pPVar7 = (PClass *)(**(code **)*puVar3)(puVar3,pTVar9,uVar12,ret);
        puVar3[1] = pPVar7;
      }
      bVar13 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar5 && bVar13) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar13 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar13) {
        pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
        goto LAB_003ce4d0;
      }
    }
  }
  else if (puVar3 != (undefined8 *)0x0) goto LAB_003ce4ae;
  if (numparam < 3) goto LAB_003ce4b7;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar10 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003ce4d0;
  }
  if (numparam == 3) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003ce4ef;
  }
  if (param[3].field_0.field_3.Type != '\x03') {
LAB_003ce4c0:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ce4ef:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7ca,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pvVar4 = param[2].field_0.field_1.a;
  type = (PClassActor *)param[3].field_0.field_1.a;
  if (param[3].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003ce193;
    bVar11 = 1;
    pPVar8 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
        if (pPVar8 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar8 != (PClassActor *)0x0);
      if (pPVar8 == (PClassActor *)0x0) {
        pcVar10 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003ce4ef;
      }
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003ce4c0;
LAB_003ce193:
    bVar11 = 0;
    type = (PClassActor *)0x0;
  }
  if (numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ce59c;
    }
    pvVar15 = param[4].field_0.field_1.a;
LAB_003ce1d3:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ce5bb:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7cc,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar13 = param[5].field_0.i == 0;
LAB_003ce1e6:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ce56b:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7cd,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar18 = param[6].field_0.f;
LAB_003ce1f7:
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ce54c:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7ce,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar19 = param[7].field_0.f;
LAB_003ce208:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ce52d:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,1999,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar12 = param[8].field_0.i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ce59c:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7cb,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar15 = (void *)param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ce1d3;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ce5bb;
    }
    bVar13 = param[5].field_0.i == 0;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ce1e6;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ce56b;
    }
    dVar18 = param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003ce1f7;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ce54c;
    }
    dVar19 = param[7].field_0.f;
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003ce208;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ce52d;
    }
    uVar12 = param[8].field_0.i;
    if (numparam != 9) {
      if (param[9].field_0.field_3.Type != '\x01') {
        pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003ce50e;
      }
      goto LAB_003ce22b;
    }
    param = defaultparam->Array;
  }
  if (param[9].field_0.field_3.Type != '\x01') {
    pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ce50e:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,2000,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ce22b:
  if (source->player != (player_t *)0x0) {
    dVar1 = param[9].field_0.f;
    if (((!(bool)(bVar13 | pvVar4 == (void *)0x0)) && (*(int *)((long)pvVar4 + 8) == 1)) &&
       (this = source->player->ReadyWeapon, this != (AWeapon *)0x0)) {
      bVar13 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1);
      bVar11 = bVar11 & bVar13;
    }
    if (bVar11 != 0) {
      dVar16 = FFastTrig::cos(&fasttrig,
                              ((source->Angles).Yaw.Degrees + -90.0) * 11930464.711111112 +
                              6755399441055744.0);
      dVar17 = FFastTrig::sin(&fasttrig,dVar16 * dVar18);
      dVar2 = (source->Angles).Pitch.Degrees;
      local_58.Degrees = (source->Angles).Yaw.Degrees;
      if ((uVar12 & 1) != 0) {
        local_58.Degrees = local_58.Degrees + (double)pvVar15;
      }
      (source->Angles).Pitch.Degrees = dVar2 - dVar1;
      this_00 = P_SpawnPlayerMissile
                          (source,dVar16 * dVar18,dVar17 * dVar18,dVar19,type,&local_58,&t,
                           (AActor **)0x0,false,SUB41((uVar12 & 4) >> 2,0),0);
      (source->Angles).Pitch.Degrees = dVar2;
      if (this_00 != (AActor *)0x0) {
        if ((uVar12 & 2) != 0) {
          this_00->Translation = source->Translation;
        }
        if (((t.linetarget != (AActor *)0x0) && (t.unlinked == false)) &&
           (((this_00->flags2).Value & 0x40000000) != 0)) {
          (this_00->tracer).field_0.p = t.linetarget;
        }
        if ((uVar12 & 1) == 0) {
          (this_00->Angles).Yaw.Degrees = (double)pvVar15 + (this_00->Angles).Yaw.Degrees;
          dVar18 = (this_00->Vel).X;
          dVar19 = (this_00->Vel).Y;
          dVar18 = c_sqrt(dVar19 * dVar19 + dVar18 * dVar18);
          AActor::VelFromAngle(this_00,dVar18);
        }
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireProjectile)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_CLASS		(ti, AActor);
	PARAM_ANGLE_DEF	(angle);
	PARAM_BOOL_DEF	(useammo);
	PARAM_FLOAT_DEF	(spawnofs_xy);
	PARAM_FLOAT_DEF	(spawnheight);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(pitch);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;
	FTranslatedLineTarget t;

		// Only use ammo if called from a weapon
	if (useammo && ACTION_CALL_FROM_PSPRITE() && weapon)
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (ti) 
	{
		DAngle ang = self->Angles.Yaw - 90;
		DVector2 ofs = ang.ToVector(spawnofs_xy);
		DAngle shootangle = self->Angles.Yaw;

		if (flags & FPF_AIMATANGLE) shootangle += angle;

		// Temporarily adjusts the pitch
		DAngle saved_player_pitch = self->Angles.Pitch;
		self->Angles.Pitch -= pitch;
		AActor * misl=P_SpawnPlayerMissile (self, ofs.X, ofs.Y, spawnheight, ti, shootangle, &t, NULL, false, (flags & FPF_NOAUTOAIM) != 0);
		self->Angles.Pitch = saved_player_pitch;

		// automatic handling of seeker missiles
		if (misl)
		{
			if (flags & FPF_TRANSFERTRANSLATION)
				misl->Translation = self->Translation;
			if (t.linetarget && !t.unlinked && (misl->flags2 & MF2_SEEKERMISSILE))
				misl->tracer = t.linetarget;
			if (!(flags & FPF_AIMATANGLE))
			{
				// This original implementation is to aim straight ahead and then offset
				// the angle from the resulting direction. 
				misl->Angles.Yaw += angle;
				misl->VelFromAngle(misl->VelXYToSpeed());
			}
		}
	}
	return 0;
}